

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O2

void train<dynet::AttentionalModel<dynet::SimpleRNNBuilder>>
               (Model *model,AttentionalModel<dynet::SimpleRNNBuilder> *am,Corpus *training,
               Corpus *devel,Trainer *sgd,string *out_file,bool curriculum,int max_epochs,bool doco,
               float coverage,bool display,bool fert)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  Expression *pEVar12;
  ostream *poVar13;
  vector<int,_std::allocator<int>_> *pvVar14;
  Expression *pEVar15;
  Tensor *pTVar16;
  long lVar17;
  uint uVar18;
  pointer ptVar19;
  VariableIndex VVar20;
  ulong uVar21;
  uint i_1;
  uint uVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  double local_490;
  int docid;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  Sentence tsent;
  int local_440;
  uint local_43c;
  Sentence ssent;
  Expression objective;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  size_type local_3d8;
  double local_3b8;
  Expression local_3a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  order_by_length;
  Expression fertility_nll;
  Expression coverage_penalty;
  Expression xent;
  Expression iloss;
  _Vector_base<int,_std::allocator<int>_> local_2f8;
  _Vector_base<int,_std::allocator<int>_> local_2e0;
  Expression alignment;
  Expression local_240;
  multimap<unsigned_long,_unsigned_int,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
  lengths;
  
  local_3d8 = ((long)(training->
                     super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(training->
                    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&order,local_3d8,(allocator_type *)&lengths);
  for (uVar18 = 0;
      (ulong)uVar18 <
      (ulong)((long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar18 = uVar18 + 1) {
    order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar18] = uVar18;
  }
  order_by_length.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  order_by_length.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  order_by_length.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (curriculum) {
    p_Var1 = &lengths._M_t._M_impl.super__Rb_tree_header;
    uVar21 = 0;
    lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lengths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    while( true ) {
      ptVar19 = (training->
                super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(training->
                         super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar19) / 0x38) <=
          uVar21) break;
      alignment.pg = (ComputationGraph *)
                     ((long)*(pointer *)
                             ((long)&ptVar19[uVar21].
                                     super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                                     .
                                     super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>
                                     ._M_head_impl + 8) -
                      *(long *)&ptVar19[uVar21].
                                super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                                .
                                super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>
                                ._M_head_impl.super__Vector_base<int,_std::allocator<int>_> >> 2);
      alignment.i.t = (uint)uVar21;
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
      ::_M_emplace_equal<std::pair<unsigned_long,unsigned_int>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::_Select1st<std::pair<unsigned_long_const,unsigned_int>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
                  *)&lengths,(pair<unsigned_long,_unsigned_int> *)&alignment);
      uVar21 = (ulong)((uint)uVar21 + 1);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::resize(&order_by_length,10);
    uVar21 = 0;
    p_Var11 = lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var11 != p_Var1) {
      for (uVar10 = uVar21 / lengths._M_t._M_impl.super__Rb_tree_header._M_node_count; uVar10 < 10;
          uVar10 = uVar10 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (order_by_length.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10,
                   (value_type_conflict3 *)&p_Var11[1]._M_parent);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      uVar21 = (ulong)((int)uVar21 + 10);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
    ::~_Rb_tree(&lengths._M_t);
  }
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (display) {
    uVar18 = 0;
    while( true ) {
      ptVar19 = (devel->
                super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(devel->
                         super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar19) / 0x38) <=
          (ulong)uVar18) break;
      lengths._M_t._M_impl._0_8_ = &docid;
      lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &tsent;
      lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&ssent;
      std::
      _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
      ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                  *)&lengths,
                 &ptVar19[uVar18].
                  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                );
      dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&lengths);
      alignment.pg = (ComputationGraph *)0x0;
      alignment.i.t = 0;
      if (doco) {
        pEVar12 = (Expression *)context(devel,uVar18);
      }
      else {
        pEVar12 = (Expression *)0x0;
      }
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                ((AttentionalModel<dynet::SimpleRNNBuilder> *)&iloss,
                 (vector<int,_std::allocator<int>_> *)am,(vector<int,_std::allocator<int>_> *)&ssent
                 ,(ComputationGraph *)&tsent,(Expression *)&lengths,
                 (vector<int,_std::allocator<int>_> *)&alignment,pEVar12,(Expression *)0x0);
      dynet::ComputationGraph::forward((Expression *)&lengths);
      poVar13 = std::operator<<((ostream *)&std::cout,"\n====== SENTENCE ");
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::operator<<(poVar13," =========\n");
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                (am,(vector<int,_std::allocator<int>_> *)&ssent,&tsent,(ComputationGraph *)&lengths,
                 &alignment,&sd,&td);
      std::operator<<((ostream *)&std::cout,"\n");
      dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                (am,(vector<int,_std::allocator<int>_> *)&ssent,&tsent,(ComputationGraph *)&lengths,
                 &alignment,&sd,&td);
      std::operator<<((ostream *)&std::cout,"\n");
      dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&lengths);
      uVar18 = uVar18 + 1;
    }
  }
  else {
    uVar18 = 0;
    local_440 = 0;
    local_43c = 0;
    pEVar12 = (Expression *)0x0;
    if (0.0 < coverage) {
      pEVar12 = &coverage_penalty;
    }
    local_3b8 = 9e+99;
    bVar7 = true;
    while (*(float *)(sgd + 0x14) < (float)max_epochs) {
      std::__cxx11::string::string((string *)&lengths,"completed in",(allocator *)&alignment);
      dynet::Timer::Timer((Timer *)&iloss,(string *)&lengths);
      std::__cxx11::string::~string((string *)&lengths);
      local_440 = local_440 + 0x32;
      iVar9 = 0;
      iVar8 = 0;
      local_3e0 = 0.0;
      local_3e8 = 0.0;
      local_3f0 = 0.0;
      for (lVar17 = 0; lVar17 != 0x32; lVar17 = lVar17 + 1) {
        if (((long)(training->
                   super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(training->
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x38 == (local_3d8 & 0xffffffff)) {
          if (!bVar7) {
            dynet::Trainer::update_epoch(sgd,1.0);
          }
          if ((curriculum) &&
             ((ulong)local_43c <
              (ulong)(((long)order_by_length.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)order_by_length.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18))) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&order,order_by_length.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_43c);
            poVar13 = std::operator<<((ostream *)&std::cerr,"Curriculum learning, with ");
            poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
            std::operator<<(poVar13," examples\n");
            local_43c = local_43c + 1;
          }
          bVar7 = false;
          uVar22 = 0;
        }
        else {
          uVar22 = (uint)local_3d8;
        }
        uVar21 = (ulong)uVar22;
        if (uVar21 % (ulong)((long)order.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)order.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2) == 0) {
          std::operator<<((ostream *)&std::cerr,"**SHUFFLE\n");
          std::
          shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_finish,dynet::rndeng);
        }
        ptVar19 = (training->
                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((lVar17 == 0x31) && (verbose != false)) {
          lengths._M_t._M_impl._0_8_ = &docid;
          lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &tsent;
          lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&ssent;
          std::
          _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
          ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                    ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                      *)&lengths,
                     &ptVar19[order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start
                              [uVar21 % (ulong)((long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]].
                      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    );
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&lengths);
          std::operator<<((ostream *)&std::cerr,"\nDecoding source, greedy Viterbi: ");
          if (doco) {
            pvVar14 = context(training,order.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [uVar21 % (ulong)((long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
          }
          else {
            pvVar14 = (vector<int,_std::allocator<int>_> *)0x0;
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::greedy_decode
                    ((vector<int,_std::allocator<int>_> *)&local_2e0,am,&ssent,
                     (ComputationGraph *)&lengths,&td,pvVar14);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2e0);
          std::operator<<((ostream *)&std::cerr,"\nDecoding source, sampling: ");
          if (doco) {
            pvVar14 = context(training,order.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [uVar21 % (ulong)((long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
          }
          else {
            pvVar14 = (vector<int,_std::allocator<int>_> *)0x0;
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::sample
                    ((vector<int,_std::allocator<int>_> *)&local_2f8,am,&ssent,
                     (ComputationGraph *)&lengths,&td,pvVar14);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2f8);
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&lengths);
          ptVar19 = (training->
                    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        lengths._M_t._M_impl._0_8_ = &docid;
        lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &tsent;
        lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&ssent;
        std::
        _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
        ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                  ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                    *)&lengths,
                   &ptVar19[order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [uVar21 % (ulong)((long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  );
        dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&lengths);
        local_3d8 = (size_type)(uVar22 + 1);
        alignment.pg = (ComputationGraph *)0x0;
        coverage_penalty.pg = (ComputationGraph *)0x0;
        alignment.i.t = 0;
        coverage_penalty.i.t = 0;
        uVar21 = (long)ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)ssent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar10 = (long)tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (doco) {
          pEVar15 = (Expression *)
                    context(training,order.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [local_3d8 %
                                      (ulong)((long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)order.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2)]);
        }
        else {
          pEVar15 = (Expression *)0x0;
        }
        dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                  ((AttentionalModel<dynet::SimpleRNNBuilder> *)&xent,
                   (vector<int,_std::allocator<int>_> *)am,&ssent,(ComputationGraph *)&tsent,
                   (Expression *)&lengths,(vector<int,_std::allocator<int>_> *)&alignment,pEVar15,
                   pEVar12);
        objective.pg = xent.pg;
        objective.i = xent.i;
        if (0.0 < coverage) {
          dynet::expr::operator*(&local_240,coverage);
          dynet::expr::operator+(&local_3a8,&objective);
          objective.pg = local_3a8.pg;
          objective.i.t = local_3a8.i.t;
        }
        if (fert) {
          dynet::expr::operator+(&local_3a8,&objective);
          objective.pg = local_3a8.pg;
          objective.i.t = local_3a8.i.t;
        }
        dynet::ComputationGraph::forward((Expression *)&lengths);
        VVar20.t = (uint)(string *)&lengths;
        pTVar16 = (Tensor *)dynet::ComputationGraph::get_value(VVar20);
        fVar23 = (float)dynet::as_scalar(pTVar16);
        if (0.0 < coverage) {
          pTVar16 = (Tensor *)dynet::ComputationGraph::get_value(VVar20);
          fVar24 = (float)dynet::as_scalar(pTVar16);
          local_3e8 = local_3e8 + (double)fVar24;
        }
        if (fert) {
          pTVar16 = (Tensor *)dynet::ComputationGraph::get_value(VVar20);
          fVar24 = (float)dynet::as_scalar(pTVar16);
          local_3f0 = local_3f0 + (double)fVar24;
        }
        dynet::ComputationGraph::backward((Expression *)&lengths);
        dynet::Trainer::update(1.0);
        if (verbose == true) {
          poVar13 = std::operator<<((ostream *)&std::cerr,"chug ");
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
          std::operator<<(poVar13,"\r");
          std::ostream::flush();
          if (lVar17 == 0x31) {
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_ascii
                      (am,&ssent,&tsent,(ComputationGraph *)&lengths,&alignment,&sd,&td);
            std::operator<<((ostream *)&std::cout,"\n");
            dynet::AttentionalModel<dynet::SimpleRNNBuilder>::display_tikz
                      (am,&ssent,&tsent,(ComputationGraph *)&lengths,&alignment,&sd,&td);
            std::operator<<((ostream *)&std::cout,"\n");
          }
        }
        iVar8 = iVar8 + -1 + (int)(uVar21 >> 2);
        iVar9 = iVar9 + -1 + (int)(uVar10 >> 2);
        local_3e0 = local_3e0 + (double)fVar23;
        dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&lengths);
      }
      dynet::Trainer::status(sgd);
      std::operator<<((ostream *)&std::cerr," E = ");
      auVar2._8_8_ = in_XMM2_Qb;
      auVar2._0_8_ = in_XMM2_Qa;
      auVar2 = vcvtusi2sd_avx512f(auVar2,iVar9);
      local_3e0 = local_3e0 / auVar2._0_8_;
      poVar13 = std::ostream::_M_insert<double>(local_3e0);
      std::operator<<(poVar13," ppl=");
      dVar25 = exp(local_3e0);
      poVar13 = std::ostream::_M_insert<double>(dVar25);
      std::operator<<(poVar13,' ');
      if (0.0 < coverage) {
        std::operator<<((ostream *)&std::cerr,"cover=");
        auVar3._8_8_ = in_XMM2_Qb;
        auVar3._0_8_ = in_XMM2_Qa;
        auVar2 = vcvtusi2sd_avx512f(auVar3,iVar8);
        poVar13 = std::ostream::_M_insert<double>(local_3e8 / auVar2._0_8_);
        std::operator<<(poVar13,' ');
      }
      if (fert) {
        std::operator<<((ostream *)&std::cerr,"fert_ppl=");
        auVar4._8_8_ = in_XMM2_Qb;
        auVar4._0_8_ = in_XMM2_Qa;
        auVar2 = vcvtusi2sd_avx512f(auVar4,iVar8);
        dVar25 = exp(local_3f0 / auVar2._0_8_);
        poVar13 = std::ostream::_M_insert<double>(dVar25);
        std::operator<<(poVar13,' ');
      }
      uVar18 = uVar18 + 1;
      if (uVar18 % 500 == 0) {
        iVar8 = 0;
        uVar22 = 0;
        local_490 = 0.0;
        while( true ) {
          ptVar19 = (devel->
                    super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(devel->
                             super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)ptVar19) / 0x38) <=
              (ulong)uVar22) break;
          lengths._M_t._M_impl._0_8_ = &docid;
          lengths._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &tsent;
          lengths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&ssent;
          std::
          _Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
          ::_M_assign<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                    ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>
                      *)&lengths,
                     &ptVar19[uVar22].
                      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    );
          dynet::ComputationGraph::ComputationGraph((ComputationGraph *)&lengths);
          if (doco) {
            pEVar15 = (Expression *)context(devel,uVar22);
          }
          else {
            pEVar15 = (Expression *)0x0;
          }
          dynet::AttentionalModel<dynet::SimpleRNNBuilder>::BuildGraph
                    ((AttentionalModel<dynet::SimpleRNNBuilder> *)&alignment,
                     (vector<int,_std::allocator<int>_> *)am,&ssent,(ComputationGraph *)&tsent,
                     (Expression *)&lengths,(vector<int,_std::allocator<int>_> *)0x0,pEVar15,
                     (Expression *)0x0);
          pTVar16 = (Tensor *)dynet::ComputationGraph::forward((Expression *)&lengths);
          fVar23 = (float)dynet::as_scalar(pTVar16);
          iVar8 = iVar8 + -1 +
                  (int)((ulong)((long)tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)tsent.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2);
          local_490 = local_490 + (double)fVar23;
          dynet::ComputationGraph::~ComputationGraph((ComputationGraph *)&lengths);
          uVar22 = uVar22 + 1;
        }
        if (local_490 < local_3b8) {
          std::ofstream::ofstream((string *)&lengths,(string *)out_file,_S_out);
          boost::archive::text_oarchive::text_oarchive
                    ((text_oarchive *)&alignment,(ostream *)&lengths,0);
          boost::archive::detail::save_non_pointer_type<boost::archive::text_oarchive>::
          save_standard::invoke<dynet::Model>((text_oarchive *)&alignment,model);
          boost::archive::text_oarchive_impl<boost::archive::text_oarchive>::~text_oarchive_impl
                    ((text_oarchive_impl<boost::archive::text_oarchive> *)&alignment);
          std::ofstream::~ofstream((string *)&lengths);
          local_3b8 = local_490;
        }
        std::operator<<((ostream *)&std::cerr,"\n***DEV [epoch=");
        auVar5._8_8_ = in_XMM2_Qb;
        auVar5._0_8_ = in_XMM2_Qa;
        auVar2 = vcvtusi2sd_avx512f(auVar5,local_440);
        auVar6._8_8_ = in_XMM2_Qb;
        auVar6._0_8_ = in_XMM2_Qa;
        auVar3 = vcvtusi2sd_avx512f(auVar6,((long)(training->
                                                  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(training->
                                                 super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start) / 0x38)
        ;
        poVar13 = std::ostream::_M_insert<double>(auVar2._0_8_ / auVar3._0_8_);
        std::operator<<(poVar13,"] E = ");
        poVar13 = std::ostream::_M_insert<double>(local_490 / (double)iVar8);
        std::operator<<(poVar13," ppl=");
        dVar25 = exp(local_490 / (double)iVar8);
        poVar13 = std::ostream::_M_insert<double>(dVar25);
        std::operator<<(poVar13,' ');
      }
      dynet::Timer::~Timer((Timer *)&iloss);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tsent.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&ssent.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&order_by_length);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void train(Model &model, AM_t &am, Corpus &training, Corpus &devel, 
	Trainer &sgd, string out_file, bool curriculum, int max_epochs, 
        bool doco, float coverage, bool display, bool fert)
{
    double best = 9e+99;
    unsigned report_every_i = 50;
    unsigned dev_every_i_reports = 500; 
    unsigned si = training.size();
    vector<unsigned> order(training.size());
    for (unsigned i = 0; i < order.size(); ++i) order[i] = i;

    vector<vector<unsigned>> order_by_length; 
    const unsigned curriculum_steps = 10;
    if (curriculum) {
	// simple form of curriculum learning: for the first K epochs, use only
	// the shortest examples from the training set. E.g., K=10, then in
	// epoch 0 using the first decile, epoch 1 use the first & second
	// deciles etc. up to the full dataset in k >= 9.
	multimap<size_t, unsigned> lengths;
	for (unsigned i = 0; i < training.size(); ++i) 
	    lengths.insert(make_pair(get<0>(training[i]).size(), i));

	order_by_length.resize(curriculum_steps);
	unsigned i = 0;
	for (auto& landi: lengths) {
	    for (unsigned k = i * curriculum_steps / lengths.size(); k < curriculum_steps; ++k)  
		order_by_length[k].push_back(landi.second);
	    ++i;
	}
    }

    bool first = true;
    unsigned report = 0;
    unsigned lines = 0;
    unsigned epoch = 0;
    Sentence ssent, tsent;
    int docid;

    // FIXME: move this into sep function
    if (display) {
        // display the alignments
        //
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            ComputationGraph cg;
            Expression alignment;
            auto iloss = am.BuildGraph(ssent, tsent, cg, &alignment, (doco) ? context(devel, i) : nullptr);
            cg.forward(iloss);

            cout << "\n====== SENTENCE " << i << " =========\n";
            am.display_ascii(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";

            am.display_tikz(ssent, tsent, cg, alignment, sd, td);
            cout << "\n";
        }

        return;
    }

#if 0
        if (true) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr);
                dloss += as_scalar(cg.forward());
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
#endif

    while (sgd.epoch < max_epochs) {
        Timer iteration("completed in");
        double loss = 0;
        double penalty = 0;
        double loss_fert = 0;
        unsigned words_src = 0;
        unsigned words_tgt = 0;

        for (unsigned iter = 0; iter < report_every_i; ++iter) {

            if (si == training.size()) {
                si = 0;
                if (first) { first = false; } else { sgd.update_epoch(); }

		if (curriculum && epoch < order_by_length.size()) {
		    order = order_by_length[epoch++];
		    cerr << "Curriculum learning, with " << order.size() << " examples\n";
		} 
	    }

            if (si % order.size() == 0) {
                cerr << "**SHUFFLE\n";
                shuffle(order.begin(), order.end(), *rndeng);
	    }

	    if (verbose && iter+1 == report_every_i) {
		tie(ssent, tsent, docid) = training[order[si % order.size()]];
		ComputationGraph cg;
                cerr << "\nDecoding source, greedy Viterbi: ";
                am.greedy_decode(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);

                cerr << "\nDecoding source, sampling: ";
                am.sample(ssent, cg, td, (doco) ? context(training, order[si % order.size()]) : nullptr);
	    }

            // build graph for this instance
	    tie(ssent, tsent, docid) = training[order[si % order.size()]];
	    ComputationGraph cg;
            words_src += ssent.size() - 1;
            words_tgt += tsent.size() - 1;
            ++si;
            Expression alignment, coverage_penalty, fertility_nll;
            Expression xent = am.BuildGraph(ssent, tsent, cg, &alignment, 
                    (doco) ? context(training, order[si % order.size()]) : nullptr, 
                    (coverage > 0) ? &coverage_penalty : nullptr,
                    (fert) ? &fertility_nll : nullptr);

            Expression objective = xent;
            if (coverage > 0) 
                objective = objective + coverage * coverage_penalty;
            if (fert) 
                objective = objective + fertility_nll;

            // perform forward computation for aggregate objective
            cg.forward(objective);

            // grab the parts of the objective
            loss += as_scalar(cg.get_value(xent.i));
            if (coverage > 0) 
                penalty += as_scalar(cg.get_value(coverage_penalty.i));
            if (fert) 
                loss_fert += as_scalar(cg.get_value(fertility_nll.i));

            cg.backward(objective);
	    sgd.update();
            ++lines;

	    if (verbose) {
		cerr << "chug " << iter << "\r" << flush;
		if (iter+1 == report_every_i) {
		    // display the alignment
		    am.display_ascii(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		    am.display_tikz(ssent, tsent, cg, alignment, sd, td);
                    cout << "\n";
		}
	    }
        }
        sgd.status();

        //loss -= coverage * penalty - loss_fert;
        cerr << " E = " << (loss / words_tgt) << " ppl=" << exp(loss / words_tgt) << ' ';
        if (coverage > 0) 
            cerr << "cover=" << penalty/words_src << ' ';
        if (fert)
            cerr << "fert_ppl=" << exp(loss_fert / words_src) << ' ';

        // show score on dev data?
        report++;
        if (report % dev_every_i_reports == 0) {
            double dloss = 0;
            int dchars = 0;
            for (unsigned i = 0; i < devel.size(); ++i) {
                tie(ssent, tsent, docid) = devel[i];
                ComputationGraph cg;
                auto idloss = am.BuildGraph(ssent, tsent, cg, nullptr, (doco) ? context(devel, i) : nullptr, nullptr, nullptr);
                dloss += as_scalar(cg.forward(idloss));
                dchars += tsent.size() - 1;
            }
            if (dloss < best) {
                best = dloss;
                ofstream out(out_file, ofstream::out);
                boost::archive::text_oarchive oa(out);
                oa << model;
            }
            //else{
            //	sgd.eta *= 0.5;
            //}
            cerr << "\n***DEV [epoch=" << (lines / (double)training.size()) << "] E = " << (dloss / dchars) << " ppl=" << exp(dloss / dchars) << ' ';
        }
    }
}